

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-3.c
# Opt level: O1

int CheckerBig5(void)

{
  _Bool _Var1;
  int iVar2;
  FILE *__stream;
  uint uVar3;
  char *__s;
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    uVar3 = 0xffffffff;
    __s = "can\'t open out.txt";
  }
  else {
    _Var1 = Check("None",10000,(FILE *)__stream);
    if (_Var1) {
      iVar2 = HaveGarbageAtTheEnd((FILE *)__stream);
      _Var1 = iVar2 == 0;
    }
    fclose(__stream);
    __s = "FAILED";
    if (_Var1 != false) {
      __s = "PASSED";
    }
    uVar3 = (uint)(_Var1 ^ 1);
  }
  puts(__s);
  testN = testN + 1;
  return uVar3;
}

Assistant:

static int CheckerBig5(void) {
    FILE *const out = fopen("out.txt", "r");
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    bool passed = Check("None", MAX_WORD_LENGTH, out);
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        testN++;
        return 0;
    } else {
        printf("FAILED\n");
        testN++;
        return 1;
    }
}